

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BayesianProbitRegressor::MergePartialFromCodedStream
          (BayesianProbitRegressor *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short extraout_AX_03;
  short extraout_AX_04;
  short extraout_AX_05;
  short extraout_AX_06;
  short sVar6;
  uint extraout_EAX;
  uint32 uVar7;
  BayesianProbitRegressor_Gaussian *this_00;
  ulong extraout_RAX;
  Type *this_01;
  pair<int,_int> pVar8;
  int iVar9;
  int byte_limit;
  uint uVar10;
  ulong uVar11;
  int local_8c;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar7 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar10) < 0x80)) goto LAB_00515115;
        uVar10 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_00515115:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_00514ed6_caseD_4;
    iVar9 = local_8c;
    switch((uint)(uVar11 >> 3) & 0x1fffffff) {
    case 1:
      MergePartialFromCodedStream();
      if (extraout_AX_01 == 0) goto switchD_00514ed6_caseD_4;
      iVar9 = 6;
      sVar6 = extraout_AX_01;
      goto joined_r0x005150ab;
    case 2:
      if ((char)uVar11 != '\x12') goto switchD_00514ed6_caseD_4;
      if (this->bias_ == (BayesianProbitRegressor_Gaussian *)0x0) {
        this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
        BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00);
        this->bias_ = this_00;
      }
      MergePartialFromCodedStream();
      if ((extraout_RAX & 1) == 0) goto LAB_005150dd;
      goto LAB_005150df;
    case 3:
      if ((char)uVar11 != '\x1a') goto switchD_00514ed6_caseD_4;
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                          (&(this->features_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar9 = 6;
      if ((((!bVar5) ||
           (pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,byte_limit), (long)pVar8 < 0)) ||
          (bVar5 = BayesianProbitRegressor_FeatureWeight::MergePartialFromCodedStream(this_01,input)
          , !bVar5)) ||
         (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar8.first), !bVar5)) goto LAB_005150df;
      goto LAB_005150dd;
    default:
      goto switchD_00514ed6_caseD_4;
    case 10:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_04;
      break;
    case 0xb:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_06;
      break;
    case 0xc:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX;
      break;
    case 0xd:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_00;
      break;
    case 0x14:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_05;
      break;
    case 0x15:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_02;
      break;
    case 0x16:
      MergePartialFromCodedStream();
      sVar6 = extraout_AX_03;
      break;
    case 0x17:
      MergePartialFromCodedStream();
      if ((short)extraout_EAX == 1) goto LAB_005150dd;
      if ((extraout_EAX & 0xffff) != 0) goto LAB_005150df;
      goto switchD_00514ed6_caseD_4;
    }
    if (sVar6 == 0) {
switchD_00514ed6_caseD_4:
      iVar9 = 7;
      if ((uVar10 & 7) != 4 && uVar10 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
        if (bVar5) goto LAB_005150dd;
        iVar9 = 6;
      }
    }
    else {
joined_r0x005150ab:
      if (sVar6 == 1) {
LAB_005150dd:
        iVar9 = 0;
      }
    }
LAB_005150df:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool BayesianProbitRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 numberOfFeatures = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &numberoffeatures_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_features()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string regressionInputFeatureName = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_regressioninputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string optimismInputFeatureName = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_optimisminputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingScaleInputFeatureName = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingscaleinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingTruncationInputFeatureName = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingtruncationinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string meanOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_meanoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string varianceOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_varianceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_pessimisticprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string sampledProbabilityOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_sampledprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor)
  return false;
#undef DO_
}